

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O3

void X509_ALGOR_get0(ASN1_OBJECT **paobj,int *pptype,void **ppval,X509_ALGOR *algor)

{
  ASN1_TYPE *a;
  void *pvVar1;
  int iVar2;
  
  if (paobj != (ASN1_OBJECT **)0x0) {
    *paobj = algor->algorithm;
  }
  if (pptype != (int *)0x0) {
    a = algor->parameter;
    if (a == (ASN1_TYPE *)0x0) {
      iVar2 = -1;
      pvVar1 = (void *)0x0;
    }
    else {
      iVar2 = a->type;
      pvVar1 = asn1_type_value_as_pointer((ASN1_TYPE *)a);
    }
    *pptype = iVar2;
    if (ppval != (void **)0x0) {
      *ppval = pvVar1;
    }
  }
  return;
}

Assistant:

void X509_ALGOR_get0(const ASN1_OBJECT **out_obj, int *out_param_type,
                     const void **out_param_value, const X509_ALGOR *alg) {
  if (out_obj != NULL) {
    *out_obj = alg->algorithm;
  }
  if (out_param_type != NULL) {
    int type = V_ASN1_UNDEF;
    const void *value = NULL;
    if (alg->parameter != NULL) {
      type = alg->parameter->type;
      value = asn1_type_value_as_pointer(alg->parameter);
    }
    *out_param_type = type;
    if (out_param_value != NULL) {
      *out_param_value = value;
    }
  }
}